

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawListSharedData::ImDrawListSharedData(ImDrawListSharedData *this)

{
  ImVec2 *in_RDI;
  float fVar1;
  float fVar2;
  float a;
  int i;
  ImVec2 *local_20;
  ImVec2 local_18;
  float local_10;
  int local_c;
  
  ImVec2::ImVec2(in_RDI);
  ImVec4::ImVec4((ImVec4 *)&in_RDI[3].y);
  local_20 = in_RDI + 6;
  do {
    ImVec2::ImVec2(local_20);
    local_20 = local_20 + 1;
  } while (local_20 != in_RDI + 0x36);
  memset(in_RDI,0,0x200);
  for (local_c = 0; local_c < 0x30; local_c = local_c + 1) {
    local_10 = ((float)local_c * 2.0 * 3.1415927) / 48.0;
    fVar1 = cosf(local_10);
    fVar2 = sinf(local_10);
    ImVec2::ImVec2(&local_18,fVar1,fVar2);
    in_RDI[(long)local_c + 6] = local_18;
  }
  fVar1 = in_RDI[3].x;
  fVar2 = ImMax<float>(48.0,3.1415927);
  fVar2 = cosf(3.1415927 / fVar2);
  in_RDI[0x36].x = fVar1 / (1.0 - fVar2);
  return;
}

Assistant:

ImDrawListSharedData::ImDrawListSharedData()
{
    memset(this, 0, sizeof(*this));
    for (int i = 0; i < IM_ARRAYSIZE(ArcFastVtx); i++)
    {
        const float a = ((float)i * 2 * IM_PI) / (float)IM_ARRAYSIZE(ArcFastVtx);
        ArcFastVtx[i] = ImVec2(ImCos(a), ImSin(a));
    }
    ArcFastRadiusCutoff = IM_DRAWLIST_CIRCLE_AUTO_SEGMENT_CALC_R(IM_DRAWLIST_ARCFAST_SAMPLE_MAX, CircleSegmentMaxError);
}